

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u8 * rtreeCheckGetNode(RtreeCheck *pCheck,i64 iNode,int *pnNode)

{
  int iVar1;
  sqlite3_stmt *psVar2;
  int *in_RDX;
  undefined8 in_RSI;
  RtreeCheck *in_RDI;
  u8 *pNode;
  int nNode;
  u8 *pRet;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  RtreeCheck *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  sqlite3_stmt *pStmt;
  
  pStmt = (sqlite3_stmt *)0x0;
  if ((in_RDI->rc == 0) && (in_RDI->pGetNode == (sqlite3_stmt *)0x0)) {
    psVar2 = rtreeCheckPrepare(in_RDI,"SELECT data FROM %Q.\'%q_node\' WHERE nodeno=?",in_RDI->zDb,
                               in_RDI->zTab);
    in_RDI->pGetNode = psVar2;
  }
  if (in_RDI->rc == 0) {
    sqlite3_bind_int64(pStmt,in_stack_ffffffffffffffdc,(sqlite_int64)in_stack_ffffffffffffffd0);
    iVar1 = sqlite3_step((sqlite3_stmt *)in_RDI);
    if (iVar1 == 100) {
      iVar1 = sqlite3_column_bytes
                        ((sqlite3_stmt *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      in_stack_ffffffffffffffd0 =
           (RtreeCheck *)
           sqlite3_column_blob((sqlite3_stmt *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      pStmt = (sqlite3_stmt *)
              sqlite3_malloc64(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (pStmt == (sqlite3_stmt *)0x0) {
        in_RDI->rc = 7;
      }
      else {
        memcpy(pStmt,in_stack_ffffffffffffffd0,(long)iVar1);
        *in_RDX = iVar1;
      }
    }
    rtreeCheckReset(in_stack_ffffffffffffffd0,
                    (sqlite3_stmt *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if ((in_RDI->rc == 0) && (pStmt == (sqlite3_stmt *)0x0)) {
      rtreeCheckAppendMsg(in_RDI,"Node %lld missing from database",in_RSI);
    }
  }
  return (u8 *)pStmt;
}

Assistant:

static u8 *rtreeCheckGetNode(RtreeCheck *pCheck, i64 iNode, int *pnNode){
  u8 *pRet = 0;                   /* Return value */

  if( pCheck->rc==SQLITE_OK && pCheck->pGetNode==0 ){
    pCheck->pGetNode = rtreeCheckPrepare(pCheck,
        "SELECT data FROM %Q.'%q_node' WHERE nodeno=?",
        pCheck->zDb, pCheck->zTab
    );
  }

  if( pCheck->rc==SQLITE_OK ){
    sqlite3_bind_int64(pCheck->pGetNode, 1, iNode);
    if( sqlite3_step(pCheck->pGetNode)==SQLITE_ROW ){
      int nNode = sqlite3_column_bytes(pCheck->pGetNode, 0);
      const u8 *pNode = (const u8*)sqlite3_column_blob(pCheck->pGetNode, 0);
      pRet = sqlite3_malloc64(nNode);
      if( pRet==0 ){
        pCheck->rc = SQLITE_NOMEM;
      }else{
        memcpy(pRet, pNode, nNode);
        *pnNode = nNode;
      }
    }
    rtreeCheckReset(pCheck, pCheck->pGetNode);
    if( pCheck->rc==SQLITE_OK && pRet==0 ){
      rtreeCheckAppendMsg(pCheck, "Node %lld missing from database", iNode);
    }
  }

  return pRet;
}